

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O2

void __thiscall HighsSplitDeque::popStolen(HighsSplitDeque *this)

{
  uint32_t *puVar1;
  element_type *peVar2;
  
  puVar1 = &(this->ownerData).head;
  *puVar1 = *puVar1 - 1;
  if ((this->ownerData).allStolenCopy == false) {
    (this->ownerData).allStolenCopy = true;
    (this->stealerData).allStolen._M_base._M_i = true;
    peVar2 = (this->ownerData).workerBunk.
             super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    LOCK();
    (peVar2->haveJobs).super___atomic_base<int>._M_i =
         (peVar2->haveJobs).super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  return;
}

Assistant:

void popStolen() {
    ownerData.head -= 1;
    if (!ownerData.allStolenCopy) {
      ownerData.allStolenCopy = true;
      stealerData.allStolen.store(true, std::memory_order_relaxed);
      ownerData.workerBunk->haveJobs.fetch_add(-1, std::memory_order_release);
    }
  }